

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_RK4.cpp
# Opt level: O0

double * __thiscall PP_RK4::RK4step(PP_RK4 *this,double x,double y,double z,double t,double dt)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *dr;
  double *K4;
  double *K3;
  double *K2;
  double *K1;
  double dt_local;
  double t_local;
  double z_local;
  double y_local;
  double x_local;
  PP_RK4 *this_local;
  
  pdVar1 = RK4K1(this,x,y,z,t,dt);
  pdVar2 = RK4K2(this,x,y,z,*pdVar1,pdVar1[1],pdVar1[2],t,dt);
  pdVar3 = RK4K3(this,x,y,z,*pdVar2,pdVar2[1],pdVar2[2],t,dt);
  pdVar4 = RK4K4(this,x,y,z,*pdVar3,pdVar3[1],pdVar3[2],t,dt);
  pdVar5 = (double *)operator_new__(0x18);
  *pdVar5 = (*pdVar3 + *pdVar3 + *pdVar2 + *pdVar2 + *pdVar1 + *pdVar4) * 0.16666666666666666;
  pdVar5[1] = (pdVar3[1] + pdVar3[1] + pdVar2[1] + pdVar2[1] + pdVar1[1] + pdVar4[1]) *
              0.16666666666666666;
  pdVar5[2] = (pdVar3[2] + pdVar3[2] + pdVar2[2] + pdVar2[2] + pdVar1[2] + pdVar4[2]) *
              0.16666666666666666;
  if (pdVar1 != (double *)0x0) {
    operator_delete(pdVar1,8);
  }
  if (pdVar2 != (double *)0x0) {
    operator_delete(pdVar2,8);
  }
  if (pdVar3 != (double *)0x0) {
    operator_delete(pdVar3,8);
  }
  if (pdVar4 != (double *)0x0) {
    operator_delete(pdVar4,8);
  }
  return pdVar5;
}

Assistant:

double* PP_RK4::RK4step(double x, double y, double z, double t, double dt)
{
    double* K1 = RK4K1(x, y, z, t, dt);
    double* K2 = RK4K2(x, y, z, K1[0], K1[1], K1[2], t, dt);
    double* K3 = RK4K3(x, y, z, K2[0], K2[1], K2[2], t, dt);
    double* K4 = RK4K4(x, y, z, K3[0], K3[1], K3[2], t, dt);
    double* dr = new double[3];
    dr[0] = (1.0/6.0)*(K1[0] + 2.0*K2[0] + 2*K3[0] + K4[0]);
    dr[1] = (1.0/6.0)*(K1[1] + 2.0*K2[1] + 2*K3[1] + K4[1]);
    dr[2] = (1.0/6.0)*(K1[2] + 2.0*K2[2] + 2*K3[2] + K4[2]);
    delete K1;
    delete K2;
    delete K3;
    delete K4;
    return dr;
}